

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O2

void parse_object_should_parse_objects_with_multiple_elements(void)

{
  cJSON *child_item;
  ulong expected;
  long lVar1;
  
  assert_parse_object("{\"one\":1\t,\t\"two\"\n:2, \"three\":3}");
  child_item = (cJSON *)&item[0].child;
  assert_is_child(item[0].child,"one",8);
  assert_is_child((item[0].child)->next,"two",8);
  assert_is_child((item[0].child)->next->next,"three",8);
  reset(item);
  assert_parse_object(
                     "{\"one\":1, \"NULL\":null, \"TRUE\":true, \"FALSE\":false, \"array\":[], \"world\":\"hello\", \"object\":{}}"
                     );
  lVar1 = 0;
  expected = 0;
  while ((expected < 7 && (child_item = child_item->next, child_item != (cJSON *)0x0))) {
    assert_is_child(child_item,
                    (char *)((long)&DAT_001080ac + (long)*(int *)((long)&DAT_001080ac + lVar1)),
                    *(int *)((long)&DAT_00108090 + lVar1));
    expected = expected + 1;
    lVar1 = lVar1 + 4;
  }
  UnityAssertEqualNumber(expected,7,(char *)0x0,0x95,UNITY_DISPLAY_STYLE_INT);
  reset(item);
  return;
}

Assistant:

static void parse_object_should_parse_objects_with_multiple_elements(void)
{
    assert_parse_object("{\"one\":1\t,\t\"two\"\n:2, \"three\":3}");
    assert_is_child(item->child, "one", cJSON_Number);
    assert_is_child(item->child->next, "two", cJSON_Number);
    assert_is_child(item->child->next->next, "three", cJSON_Number);
    reset(item);

    {
        size_t i = 0;
        cJSON *node = NULL;
        int expected_types[7] =
        {
            cJSON_Number,
            cJSON_NULL,
            cJSON_True,
            cJSON_False,
            cJSON_Array,
            cJSON_String,
            cJSON_Object
        };
        const char *expected_names[7] =
        {
            "one",
            "NULL",
            "TRUE",
            "FALSE",
            "array",
            "world",
            "object"
        };
        assert_parse_object("{\"one\":1, \"NULL\":null, \"TRUE\":true, \"FALSE\":false, \"array\":[], \"world\":\"hello\", \"object\":{}}");

        node = item->child;
        for (
                i = 0;
                (i < (sizeof(expected_types)/sizeof(int)))
                && (node != NULL);
                (void)i++, node = node->next)
        {
            assert_is_child(node, expected_names[i], expected_types[i]);
        }
        TEST_ASSERT_EQUAL_INT(i, 7);
        reset(item);
    }
}